

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

bool __thiscall json11::Json::operator==(Json *this,Json *other)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  peVar1 = (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (other->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr) {
    bVar2 = true;
  }
  else {
    iVar3 = (**peVar1->_vptr_JsonValue)();
    iVar4 = (**((other->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_JsonValue)();
    if (iVar3 == iVar4) {
      peVar1 = (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar1->_vptr_JsonValue[1])
                        (peVar1,(other->m_ptr).
                                super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      return SUB41(iVar3,0);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Json::operator== (const Json &other) const {
    if (m_ptr == other.m_ptr)
        return true;
    if (m_ptr->type() != other.m_ptr->type())
        return false;

    return m_ptr->equals(other.m_ptr.get());
}